

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O3

int cymric_derive(cymric_rng *basisGenerator,void *seedBuffer,int seedBytes,cymric_rng *resultOut)

{
  int iVar1;
  int iVar2;
  size_t i;
  long lVar3;
  char key [64];
  blake2b_state state;
  uint8_t local_240 [64];
  blake2b_state local_200;
  
  iVar2 = -1;
  if (basisGenerator != (cymric_rng *)0x0 && resultOut != (cymric_rng *)0x0) {
    iVar1 = blake2b_init_key(&local_200,'@',resultOut,'@');
    iVar2 = -2;
    if (iVar1 == 0) {
      if ((0 < seedBytes && seedBuffer != (void *)0x0) &&
         (iVar2 = blake2b_update(&local_200,(uint8_t *)seedBuffer,(ulong)(uint)seedBytes),
         iVar2 != 0)) {
        return -3;
      }
      iVar1 = cymric_random(basisGenerator,local_240,0x40);
      iVar2 = -4;
      if (iVar1 == 0) {
        iVar1 = blake2b_update(&local_200,local_240,0x40);
        iVar2 = -5;
        if (iVar1 == 0) {
          iVar1 = blake2b_final(&local_200,(uint8_t *)resultOut,'@');
          iVar2 = -6;
          if (iVar1 == 0) {
            lVar3 = 0;
            do {
              local_200.buf[lVar3] = '\0';
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0x100);
            lVar3 = 0;
            do {
              local_240[lVar3] = '\0';
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0x40);
            iVar2 = 0;
            builtin_strncpy(resultOut->internal + 0x40,"SEED",4);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int cymric_derive(
    cymric_rng* basisGenerator, ///< [in] Generator to seed from
    const void* seedBuffer,     ///< [in] Additional seed buffer
    int seedBytes,              ///< [in] Seed buffer bytes
    cymric_rng* resultOut       ///< [out] Generator to seed
) {
    // If input is invalid:
    if (!resultOut || !basisGenerator)
        return -1;

    // Initialize BLAKE2 state for 512-bit output
    blake2b_state state;

    // Mix in previous or uninitialized state
    if (blake2b_init_key(&state, 64, resultOut->internal, 64))
        return -2;

    // Mix in the seed
    if (seedBuffer && seedBytes > 0) {
        if (blake2b_update(&state, (const uint8_t *)seedBuffer, seedBytes))
            return -3;
    }

    // Generate a key seed from the old RNG
    char key[64];
    if (cymric_random(basisGenerator, key, 64))
        return -4;

    // Mix in the key seed
    if (blake2b_update(&state, (const uint8_t *)key, 64))
        return -5;

    // Squeeze out 512 random bits from seed
    if (blake2b_final(&state, (uint8_t *)resultOut->internal, 64))
        return -6;

    // Erase BLAKE2 state and key
    CAT_SECURE_OBJCLR(state.buf);
    CAT_SECURE_OBJCLR(key);

    // Indicate state is seeded
    resultOut->internal[64] = 'S';
    resultOut->internal[65] = 'E';
    resultOut->internal[66] = 'E';
    resultOut->internal[67] = 'D';

    return 0;
}